

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse2::
     BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  Geometry *this;
  uint uVar10;
  uint uVar11;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  ulong uVar16;
  size_t sVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  long lVar21;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar48;
  float fVar49;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  float fVar62;
  float fVar63;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  float fVar68;
  float fVar69;
  undefined1 auVar66 [16];
  float fVar70;
  undefined1 auVar67 [16];
  float fVar71;
  float fVar72;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  fVar1 = (query->p).field_0.field_0.x;
  fVar2 = (query->p).field_0.field_0.y;
  fVar3 = (query->p).field_0.field_0.z;
  fVar71 = (context->query_radius).field_0.m128[0];
  fVar33 = (context->query_radius).field_0.m128[1];
  fVar37 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    fVar72 = query->radius * query->radius;
  }
  else {
    fVar72 = (context->query_radius).field_0.m128[0];
    fVar42 = (context->query_radius).field_0.m128[1];
    fVar48 = (context->query_radius).field_0.m128[2];
    fVar72 = fVar48 * fVar48 + fVar42 * fVar42 + fVar72 * fVar72;
  }
  pSVar22 = stack + 1;
  bVar15 = false;
  do {
LAB_005779c8:
    do {
      do {
        if (pSVar22 == stack) {
          return bVar15;
        }
        pSVar12 = pSVar22 + -1;
        pSVar22 = pSVar22 + -1;
      } while (fVar72 < (float)pSVar12->dist);
      sVar17 = (pSVar22->ptr).ptr;
LAB_005779e5:
      uVar18 = (uint)sVar17;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((sVar17 & 8) != 0) goto LAB_00577e9e;
        uVar16 = sVar17 & 0xfffffffffffffff0;
        fVar42 = query->time;
        auVar26._4_4_ = fVar42;
        auVar26._0_4_ = fVar42;
        auVar26._8_4_ = fVar42;
        auVar26._12_4_ = fVar42;
        auVar38._0_4_ = *(float *)(uVar16 + 0x80) * fVar42 + *(float *)(uVar16 + 0x20);
        auVar38._4_4_ = *(float *)(uVar16 + 0x84) * fVar42 + *(float *)(uVar16 + 0x24);
        auVar38._8_4_ = *(float *)(uVar16 + 0x88) * fVar42 + *(float *)(uVar16 + 0x28);
        auVar38._12_4_ = *(float *)(uVar16 + 0x8c) * fVar42 + *(float *)(uVar16 + 0x2c);
        auVar34._0_4_ = *(float *)(uVar16 + 0xa0) * fVar42 + *(float *)(uVar16 + 0x40);
        auVar34._4_4_ = *(float *)(uVar16 + 0xa4) * fVar42 + *(float *)(uVar16 + 0x44);
        auVar34._8_4_ = *(float *)(uVar16 + 0xa8) * fVar42 + *(float *)(uVar16 + 0x48);
        auVar34._12_4_ = *(float *)(uVar16 + 0xac) * fVar42 + *(float *)(uVar16 + 0x4c);
        auVar29._0_4_ = *(float *)(uVar16 + 0xc0) * fVar42 + *(float *)(uVar16 + 0x60);
        auVar29._4_4_ = *(float *)(uVar16 + 0xc4) * fVar42 + *(float *)(uVar16 + 100);
        auVar29._8_4_ = *(float *)(uVar16 + 200) * fVar42 + *(float *)(uVar16 + 0x68);
        auVar29._12_4_ = *(float *)(uVar16 + 0xcc) * fVar42 + *(float *)(uVar16 + 0x6c);
        auVar45._0_4_ = *(float *)(uVar16 + 0x90) * fVar42 + *(float *)(uVar16 + 0x30);
        auVar45._4_4_ = *(float *)(uVar16 + 0x94) * fVar42 + *(float *)(uVar16 + 0x34);
        auVar45._8_4_ = *(float *)(uVar16 + 0x98) * fVar42 + *(float *)(uVar16 + 0x38);
        auVar45._12_4_ = *(float *)(uVar16 + 0x9c) * fVar42 + *(float *)(uVar16 + 0x3c);
        auVar56._0_4_ = *(float *)(uVar16 + 0xb0) * fVar42 + *(float *)(uVar16 + 0x50);
        auVar56._4_4_ = *(float *)(uVar16 + 0xb4) * fVar42 + *(float *)(uVar16 + 0x54);
        auVar56._8_4_ = *(float *)(uVar16 + 0xb8) * fVar42 + *(float *)(uVar16 + 0x58);
        auVar56._12_4_ = *(float *)(uVar16 + 0xbc) * fVar42 + *(float *)(uVar16 + 0x5c);
        auVar52._0_4_ = *(float *)(uVar16 + 0xd0) * fVar42 + *(float *)(uVar16 + 0x70);
        auVar52._4_4_ = *(float *)(uVar16 + 0xd4) * fVar42 + *(float *)(uVar16 + 0x74);
        auVar52._8_4_ = *(float *)(uVar16 + 0xd8) * fVar42 + *(float *)(uVar16 + 0x78);
        auVar52._12_4_ = *(float *)(uVar16 + 0xdc) * fVar42 + *(float *)(uVar16 + 0x7c);
        auVar60._4_4_ = fVar1;
        auVar60._0_4_ = fVar1;
        auVar60._8_4_ = fVar1;
        auVar60._12_4_ = fVar1;
        auVar31 = maxps(auVar60,auVar38);
        auVar31 = minps(auVar31,auVar45);
        fVar42 = auVar31._0_4_ - fVar1;
        fVar49 = auVar31._4_4_ - fVar1;
        fVar57 = auVar31._8_4_ - fVar1;
        fVar63 = auVar31._12_4_ - fVar1;
        auVar67._4_4_ = fVar2;
        auVar67._0_4_ = fVar2;
        auVar67._8_4_ = fVar2;
        auVar67._12_4_ = fVar2;
        auVar31 = maxps(auVar67,auVar34);
        auVar31 = minps(auVar31,auVar56);
        fVar65 = auVar31._0_4_ - fVar2;
        fVar68 = auVar31._4_4_ - fVar2;
        fVar69 = auVar31._8_4_ - fVar2;
        fVar70 = auVar31._12_4_ - fVar2;
        auVar61._4_4_ = fVar3;
        auVar61._0_4_ = fVar3;
        auVar61._8_4_ = fVar3;
        auVar61._12_4_ = fVar3;
        auVar31 = maxps(auVar61,auVar29);
        auVar31 = minps(auVar31,auVar52);
        fVar48 = auVar31._0_4_ - fVar3;
        fVar50 = auVar31._4_4_ - fVar3;
        fVar62 = auVar31._8_4_ - fVar3;
        fVar64 = auVar31._12_4_ - fVar3;
        tNear.field_0.v[0] = fVar48 * fVar48 + fVar65 * fVar65 + fVar42 * fVar42;
        tNear.field_0.v[1] = fVar50 * fVar50 + fVar68 * fVar68 + fVar49 * fVar49;
        tNear.field_0.v[2] = fVar62 * fVar62 + fVar69 * fVar69 + fVar57 * fVar57;
        tNear.field_0.v[3] = fVar64 * fVar64 + fVar70 * fVar70 + fVar63 * fVar63;
        uVar10 = (uint)(((auVar29._0_4_ <= fVar37 + fVar3 && fVar1 - fVar71 <= auVar45._0_4_) &&
                        (auVar34._0_4_ <= fVar33 + fVar2 && auVar38._0_4_ <= fVar1 + fVar71)) &&
                       (fVar3 - fVar37 <= auVar52._0_4_ &&
                       (fVar2 - fVar33 <= auVar56._0_4_ && auVar38._0_4_ <= auVar45._0_4_)));
        auVar59._0_4_ = -uVar10;
        uVar11 = (uint)(((auVar29._4_4_ <= fVar37 + fVar3 && fVar1 - fVar71 <= auVar45._4_4_) &&
                        (auVar34._4_4_ <= fVar33 + fVar2 && auVar38._4_4_ <= fVar1 + fVar71)) &&
                       (fVar3 - fVar37 <= auVar52._4_4_ &&
                       (fVar2 - fVar33 <= auVar56._4_4_ && auVar38._4_4_ <= auVar45._4_4_)));
        auVar59._4_4_ = -uVar11;
        uVar5 = (uint)(((auVar29._8_4_ <= fVar37 + fVar3 && fVar1 - fVar71 <= auVar45._8_4_) &&
                       (auVar34._8_4_ <= fVar33 + fVar2 && auVar38._8_4_ <= fVar1 + fVar71)) &&
                      (fVar3 - fVar37 <= auVar52._8_4_ &&
                      (fVar2 - fVar33 <= auVar56._8_4_ && auVar38._8_4_ <= auVar45._8_4_)));
        auVar59._8_4_ = -uVar5;
        uVar4 = (uint)(((auVar29._12_4_ <= fVar37 + fVar3 && fVar1 - fVar71 <= auVar45._12_4_) &&
                       (auVar34._12_4_ <= fVar33 + fVar2 && auVar38._12_4_ <= fVar1 + fVar71)) &&
                      (fVar3 - fVar37 <= auVar52._12_4_ &&
                      (fVar2 - fVar33 <= auVar56._12_4_ && auVar38._12_4_ <= auVar45._12_4_)));
        auVar59._12_4_ = -uVar4;
        if ((uVar18 & 7) == 6) goto LAB_00577c0c;
        auVar59._0_4_ = uVar10 * -0x80000000;
        auVar59._4_4_ = uVar11 * -0x80000000;
        auVar59._8_4_ = uVar5 * -0x80000000;
        auVar59._12_4_ = uVar4 * -0x80000000;
LAB_00577abc:
        uVar18 = movmskps(uVar18 & 7,auVar59);
LAB_00577abf:
        if (uVar18 != 0) {
          uVar16 = sVar17 & 0xfffffffffffffff0;
          lVar19 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          sVar17 = *(size_t *)(uVar16 + lVar19 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          if (uVar18 != 0) {
            uVar4 = tNear.field_0.i[lVar19];
            lVar19 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            sVar8 = *(size_t *)(uVar16 + lVar19 * 8);
            uVar5 = tNear.field_0.i[lVar19];
            uVar18 = uVar18 - 1 & uVar18;
            if (uVar18 == 0) {
              if (uVar4 < uVar5) {
                (pSVar22->ptr).ptr = sVar8;
                pSVar22->dist = uVar5;
                pSVar22 = pSVar22 + 1;
              }
              else {
                (pSVar22->ptr).ptr = sVar17;
                pSVar22->dist = uVar4;
                pSVar22 = pSVar22 + 1;
                sVar17 = sVar8;
              }
            }
            else {
              auVar25._8_4_ = uVar4;
              auVar25._0_8_ = sVar17;
              auVar25._12_4_ = 0;
              auVar30._8_4_ = uVar5;
              auVar30._0_8_ = sVar8;
              auVar30._12_4_ = 0;
              lVar19 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
              uVar9 = *(ulong *)(uVar16 + lVar19 * 8);
              iVar6 = tNear.field_0.i[lVar19];
              auVar35._8_4_ = iVar6;
              auVar35._0_8_ = uVar9;
              auVar35._12_4_ = 0;
              auVar39._8_4_ = -(uint)((int)uVar4 < (int)uVar5);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar39._4_4_ = auVar39._8_4_;
                auVar39._0_4_ = auVar39._8_4_;
                auVar39._12_4_ = auVar39._8_4_;
                auVar26 = auVar25 & auVar39 | ~auVar39 & auVar30;
                auVar31 = auVar30 & auVar39 | ~auVar39 & auVar25;
                auVar40._8_4_ = -(uint)(auVar26._8_4_ < iVar6);
                auVar40._0_8_ = CONCAT44(auVar40._8_4_,auVar40._8_4_);
                auVar40._12_4_ = auVar40._8_4_;
                sVar17 = ~auVar40._0_8_ & uVar9 | auVar26._0_8_ & auVar40._0_8_;
                auVar26 = auVar35 & auVar40 | ~auVar40 & auVar26;
                auVar27._8_4_ = -(uint)(auVar31._8_4_ < auVar26._8_4_);
                auVar27._4_4_ = auVar27._8_4_;
                auVar27._0_4_ = auVar27._8_4_;
                auVar27._12_4_ = auVar27._8_4_;
                *pSVar22 = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar27 & auVar31 | auVar26 & auVar27);
                pSVar22[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (auVar31 & auVar27 | ~auVar27 & auVar26);
                pSVar22 = pSVar22 + 2;
              }
              else {
                lVar19 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                iVar7 = tNear.field_0.i[lVar19];
                auVar46._8_4_ = iVar7;
                auVar46._0_8_ = *(undefined8 *)(uVar16 + lVar19 * 8);
                auVar46._12_4_ = 0;
                auVar41._4_4_ = auVar39._8_4_;
                auVar41._0_4_ = auVar39._8_4_;
                auVar41._8_4_ = auVar39._8_4_;
                auVar41._12_4_ = auVar39._8_4_;
                auVar26 = auVar25 & auVar41 | ~auVar41 & auVar30;
                auVar31 = auVar30 & auVar41 | ~auVar41 & auVar25;
                auVar53._0_4_ = -(uint)(iVar6 < iVar7);
                auVar53._4_4_ = -(uint)(iVar6 < iVar7);
                auVar53._8_4_ = -(uint)(iVar6 < iVar7);
                auVar53._12_4_ = -(uint)(iVar6 < iVar7);
                auVar59 = auVar35 & auVar53 | ~auVar53 & auVar46;
                auVar54 = ~auVar53 & auVar35 | auVar46 & auVar53;
                auVar36._8_4_ = -(uint)(auVar31._8_4_ < auVar54._8_4_);
                auVar36._4_4_ = auVar36._8_4_;
                auVar36._0_4_ = auVar36._8_4_;
                auVar36._12_4_ = auVar36._8_4_;
                auVar47 = auVar31 & auVar36 | ~auVar36 & auVar54;
                auVar32._8_4_ = -(uint)(auVar26._8_4_ < auVar59._8_4_);
                auVar32._0_8_ = CONCAT44(auVar32._8_4_,auVar32._8_4_);
                auVar32._12_4_ = auVar32._8_4_;
                sVar17 = auVar26._0_8_ & auVar32._0_8_ | ~auVar32._0_8_ & auVar59._0_8_;
                auVar26 = ~auVar32 & auVar26 | auVar59 & auVar32;
                auVar28._8_4_ = -(uint)(auVar26._8_4_ < auVar47._8_4_);
                auVar28._4_4_ = auVar28._8_4_;
                auVar28._0_4_ = auVar28._8_4_;
                auVar28._12_4_ = auVar28._8_4_;
                *pSVar22 = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar36 & auVar31 | auVar54 & auVar36);
                pSVar22[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (~auVar28 & auVar26 | auVar47 & auVar28);
                pSVar22[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (auVar26 & auVar28 | ~auVar28 & auVar47);
                pSVar22 = pSVar22 + 3;
              }
            }
          }
          goto LAB_005779e5;
        }
        goto LAB_005779c8;
      }
      if ((sVar17 & 8) == 0) {
        uVar16 = sVar17 & 0xfffffffffffffff0;
        fVar42 = query->time;
        auVar26._4_4_ = fVar42;
        auVar26._0_4_ = fVar42;
        auVar26._8_4_ = fVar42;
        auVar26._12_4_ = fVar42;
        auVar31._0_4_ = *(float *)(uVar16 + 0x80) * fVar42 + *(float *)(uVar16 + 0x20);
        auVar31._4_4_ = *(float *)(uVar16 + 0x84) * fVar42 + *(float *)(uVar16 + 0x24);
        auVar31._8_4_ = *(float *)(uVar16 + 0x88) * fVar42 + *(float *)(uVar16 + 0x28);
        auVar31._12_4_ = *(float *)(uVar16 + 0x8c) * fVar42 + *(float *)(uVar16 + 0x2c);
        auVar43._0_4_ = *(float *)(uVar16 + 0xa0) * fVar42 + *(float *)(uVar16 + 0x40);
        auVar43._4_4_ = *(float *)(uVar16 + 0xa4) * fVar42 + *(float *)(uVar16 + 0x44);
        auVar43._8_4_ = *(float *)(uVar16 + 0xa8) * fVar42 + *(float *)(uVar16 + 0x48);
        auVar43._12_4_ = *(float *)(uVar16 + 0xac) * fVar42 + *(float *)(uVar16 + 0x4c);
        auVar54._0_4_ = *(float *)(uVar16 + 0xc0) * fVar42 + *(float *)(uVar16 + 0x60);
        auVar54._4_4_ = *(float *)(uVar16 + 0xc4) * fVar42 + *(float *)(uVar16 + 100);
        auVar54._8_4_ = *(float *)(uVar16 + 200) * fVar42 + *(float *)(uVar16 + 0x68);
        auVar54._12_4_ = *(float *)(uVar16 + 0xcc) * fVar42 + *(float *)(uVar16 + 0x6c);
        auVar47._0_4_ = *(float *)(uVar16 + 0x90) * fVar42 + *(float *)(uVar16 + 0x30);
        auVar47._4_4_ = *(float *)(uVar16 + 0x94) * fVar42 + *(float *)(uVar16 + 0x34);
        auVar47._8_4_ = *(float *)(uVar16 + 0x98) * fVar42 + *(float *)(uVar16 + 0x38);
        auVar47._12_4_ = *(float *)(uVar16 + 0x9c) * fVar42 + *(float *)(uVar16 + 0x3c);
        auVar51._0_4_ = *(float *)(uVar16 + 0xb0) * fVar42 + *(float *)(uVar16 + 0x50);
        auVar51._4_4_ = *(float *)(uVar16 + 0xb4) * fVar42 + *(float *)(uVar16 + 0x54);
        auVar51._8_4_ = *(float *)(uVar16 + 0xb8) * fVar42 + *(float *)(uVar16 + 0x58);
        auVar51._12_4_ = *(float *)(uVar16 + 0xbc) * fVar42 + *(float *)(uVar16 + 0x5c);
        auVar55._0_4_ = *(float *)(uVar16 + 0xd0) * fVar42 + *(float *)(uVar16 + 0x70);
        auVar55._4_4_ = *(float *)(uVar16 + 0xd4) * fVar42 + *(float *)(uVar16 + 0x74);
        auVar55._8_4_ = *(float *)(uVar16 + 0xd8) * fVar42 + *(float *)(uVar16 + 0x78);
        auVar55._12_4_ = *(float *)(uVar16 + 0xdc) * fVar42 + *(float *)(uVar16 + 0x7c);
        auVar58._4_4_ = fVar1;
        auVar58._0_4_ = fVar1;
        auVar58._8_4_ = fVar1;
        auVar58._12_4_ = fVar1;
        auVar59 = maxps(auVar58,auVar31);
        auVar59 = minps(auVar59,auVar47);
        fVar57 = auVar59._0_4_ - fVar1;
        fVar62 = auVar59._4_4_ - fVar1;
        fVar63 = auVar59._8_4_ - fVar1;
        fVar64 = auVar59._12_4_ - fVar1;
        auVar66._4_4_ = fVar2;
        auVar66._0_4_ = fVar2;
        auVar66._8_4_ = fVar2;
        auVar66._12_4_ = fVar2;
        auVar59 = maxps(auVar66,auVar43);
        auVar59 = minps(auVar59,auVar51);
        fVar65 = auVar59._0_4_ - fVar2;
        fVar68 = auVar59._4_4_ - fVar2;
        fVar69 = auVar59._8_4_ - fVar2;
        fVar70 = auVar59._12_4_ - fVar2;
        auVar44._4_4_ = fVar3;
        auVar44._0_4_ = fVar3;
        auVar44._8_4_ = fVar3;
        auVar44._12_4_ = fVar3;
        auVar59 = maxps(auVar44,auVar54);
        auVar59 = minps(auVar59,auVar55);
        fVar42 = auVar59._0_4_ - fVar3;
        fVar48 = auVar59._4_4_ - fVar3;
        fVar49 = auVar59._8_4_ - fVar3;
        fVar50 = auVar59._12_4_ - fVar3;
        tNear.field_0.v[0] = fVar42 * fVar42 + fVar65 * fVar65 + fVar57 * fVar57;
        tNear.field_0.v[1] = fVar48 * fVar48 + fVar68 * fVar68 + fVar62 * fVar62;
        tNear.field_0.v[2] = fVar49 * fVar49 + fVar69 * fVar69 + fVar63 * fVar63;
        tNear.field_0.v[3] = fVar50 * fVar50 + fVar70 * fVar70 + fVar64 * fVar64;
        auVar59._0_4_ =
             -(uint)(auVar31._0_4_ <= auVar47._0_4_ && tNear.field_0.v[0] <= fVar71 * fVar71);
        auVar59._4_4_ =
             -(uint)(auVar31._4_4_ <= auVar47._4_4_ && tNear.field_0.v[1] <= fVar71 * fVar71);
        auVar59._8_4_ =
             -(uint)(auVar31._8_4_ <= auVar47._8_4_ && tNear.field_0.v[2] <= fVar71 * fVar71);
        auVar59._12_4_ =
             -(uint)(auVar31._12_4_ <= auVar47._12_4_ && tNear.field_0.v[3] <= fVar71 * fVar71);
        if ((uVar18 & 7) != 6) goto LAB_00577abc;
LAB_00577c0c:
        uVar16 = sVar17 & 0xfffffffffffffff0;
        auVar24._0_4_ =
             (-(uint)(auVar26._0_4_ < *(float *)(uVar16 + 0xf0) &&
                     *(float *)(uVar16 + 0xe0) <= auVar26._0_4_) & auVar59._0_4_) << 0x1f;
        auVar24._4_4_ =
             (-(uint)(auVar26._4_4_ < *(float *)(uVar16 + 0xf4) &&
                     *(float *)(uVar16 + 0xe4) <= auVar26._4_4_) & auVar59._4_4_) << 0x1f;
        auVar24._8_4_ =
             (-(uint)(auVar26._8_4_ < *(float *)(uVar16 + 0xf8) &&
                     *(float *)(uVar16 + 0xe8) <= auVar26._8_4_) & auVar59._8_4_) << 0x1f;
        auVar24._12_4_ =
             (-(uint)(auVar26._12_4_ < *(float *)(uVar16 + 0xfc) &&
                     *(float *)(uVar16 + 0xec) <= auVar26._12_4_) & auVar59._12_4_) << 0x1f;
        uVar18 = movmskps(uVar18 & 7,auVar24);
        goto LAB_00577abf;
      }
LAB_00577e9e:
      lVar23 = (sVar17 & 0xfffffffffffffff0) + 0x130;
      bVar14 = 0;
      for (lVar19 = 0; lVar19 != (ulong)(uVar18 & 0xf) - 8; lVar19 = lVar19 + 1) {
        bVar20 = 0;
        for (lVar21 = -0x10; lVar21 != 0; lVar21 = lVar21 + 4) {
          uVar4 = *(uint *)(lVar23 + lVar21);
          if ((ulong)uVar4 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar4].ptr;
          context->geomID = uVar4;
          context->primID = *(uint *)(lVar23 + 0x10 + lVar21);
          bVar13 = Geometry::pointQuery(this,query,context);
          bVar20 = bVar20 | bVar13;
        }
        bVar14 = bVar14 | bVar20;
        lVar23 = lVar23 + 0x140;
      }
    } while (bVar14 == 0);
    fVar71 = (context->query_radius).field_0.m128[0];
    fVar33 = (context->query_radius).field_0.m128[1];
    fVar37 = (context->query_radius).field_0.m128[2];
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      fVar72 = query->radius * query->radius;
    }
    else {
      fVar72 = fVar37 * fVar37 + fVar33 * fVar33 + fVar71 * fVar71;
    }
    bVar15 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }